

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureMipmapTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::TextureCubeMipmapCase::init(TextureCubeMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  uint uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  TextureCube *this_01;
  ulong uVar5;
  ulong extraout_RAX;
  NotSupportedError *this_02;
  int levelNdx;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  RGBA local_1d4;
  ulong local_1d0;
  int local_1c4;
  ulong local_1c0;
  ulong local_1b8;
  MessageBuilder local_1b0;
  
  iVar4 = (*this->m_renderCtxInfo->_vptr_ContextInfo[7])();
  if ((char)iVar4 == '\0') {
    local_1b0.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    this_00 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Warning: High precision not supported in fragment shaders.")
    ;
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  if ((this->m_coordType == COORDTYPE_PROJECTED) &&
     (iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])(),
     0 < *(int *)(CONCAT44(extraout_var,iVar4) + 0x20))) {
    this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,
               "Projected lookup validation not supported in multisample config",
               (allocator<char> *)&local_1d4);
    tcu::NotSupportedError::NotSupportedError(this_02,(string *)&local_1b0);
    __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_01 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (this_01,this->m_renderCtx,this->m_format,this->m_dataType,this->m_size);
  this->m_texture = this_01;
  uVar1 = this->m_size;
  uVar5 = 0x20;
  if (uVar1 != 0) {
    uVar3 = 0x1f;
    if (uVar1 != 0) {
      for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar5 = (ulong)(uVar3 ^ 0x1f);
  }
  local_1c4 = 0x1f - (int)uVar5;
  local_1d0 = (ulong)(0x20 - (int)uVar5);
  uVar7 = 0;
  do {
    if (uVar7 == 6) {
      return (int)uVar5;
    }
    local_1c0 = uVar7 & 0xffffffff;
    uVar5 = uVar7 * 0x18;
    lVar8 = 0;
    local_1b8 = uVar5;
    for (uVar6 = 0; local_1d0 != uVar6; uVar6 = uVar6 + 1) {
      if ((CubeFace)uVar7 < CUBEFACE_LAST) {
        iVar4 = (*(code *)(&DAT_005bbe50 + *(int *)(&DAT_005bbe50 + local_1c0 * 4)))();
        return iVar4;
      }
      tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)uVar7,(int)uVar6);
      lVar2 = *(long *)((long)&(this->m_texture->m_refTexture).m_access[0].
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_1b8);
      local_1d4.m_value = 0xff000000;
      tcu::RGBA::toVec(&local_1d4);
      tcu::clear((PixelBufferAccess *)(lVar2 + lVar8),(Vec4 *)&local_1b0);
      lVar8 = lVar8 + 0x28;
      uVar5 = extraout_RAX;
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void TextureCubeMipmapCase::init (void)
{
	if (!m_renderCtxInfo.isFragmentHighPrecisionSupported())
		m_testCtx.getLog() << TestLog::Message << "Warning: High precision not supported in fragment shaders." << TestLog::EndMessage;

	if (m_coordType == COORDTYPE_PROJECTED && m_renderCtx.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new TextureCube(m_renderCtx, m_format, m_dataType, m_size);

	int numLevels = deLog2Floor32(m_size)+1;

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}